

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O3

void vkt::synchronization::anon_unknown_0::createVulkanBuffer
               (DeviceInterface *vkd,VkDevice device,Allocator *allocator,
               BufferParameters *bufferParameters,Buffer *buffer,MemoryRequirement visibility)

{
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar1;
  pointer *ppVVar2;
  VkBuffer obj;
  Allocation *pAVar3;
  iterator __position;
  Handle<(vk::HandleType)8> HVar4;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  VkAllocationCallbacks *pVVar7;
  VkResult VVar8;
  Handle<(vk::HandleType)8> HVar9;
  Move<vk::Handle<(vk::HandleType)8>_> local_c8;
  DeviceInterface *local_a8;
  Allocator *local_a0;
  undefined1 local_98 [24];
  VkAllocationCallbacks *pVStack_80;
  size_t local_78;
  VkBufferCreateInfo local_68;
  
  local_68.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_68._4_4_ = 0xcdcdcdcd;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68._20_4_ = 0xcdcdcdcd;
  local_68.size = bufferParameters->size;
  local_68.usage = bufferParameters->usage;
  local_68.sharingMode = bufferParameters->sharingMode;
  local_68._44_4_ = 0xcdcdcdcd;
  local_68.queueFamilyIndexCount = bufferParameters->queueFamilyCount;
  local_68.pQueueFamilyIndices = bufferParameters->queueFamilyIndex;
  local_a0 = allocator;
  ::vk::createBuffer(&local_c8,vkd,device,&local_68,(VkAllocationCallbacks *)0x0);
  pVVar7 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pVVar6 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pDVar5 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  HVar9.m_internal = local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_98._16_8_ = local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_80 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_98._0_8_ = local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_98._8_8_ =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar1 = &buffer->buffer;
  obj.m_internal =
       (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = pVVar6;
    (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVVar7;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         HVar9.m_internal;
    (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         pDVar5;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj);
    (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)local_98._16_8_;
    (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVStack_80;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         local_98._0_8_;
    (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_98._8_8_;
    if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
  }
  local_a8 = vkd;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_98,vkd,device,
             (VkBuffer)
             (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*local_a0->_vptr_Allocator[3])
            (&local_c8,local_a0,(VkMemoryRequirements *)local_98,(ulong)visibility.m_flags);
  HVar4.m_internal = local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  HVar9.m_internal =
       (deUint64)
       (buffer->allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr;
  if (HVar9.m_internal != HVar4.m_internal) {
    if ((Allocation *)HVar9.m_internal == (Allocation *)0x0) {
      (buffer->allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)HVar4.m_internal;
      HVar9.m_internal = HVar4.m_internal;
    }
    else {
      (*((Allocation *)HVar9.m_internal)->_vptr_Allocation[1])();
      (buffer->allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)HVar4.m_internal;
      HVar9.m_internal = HVar4.m_internal;
      if ((long *)local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
          (long *)0x0) {
        (**(code **)(*(long *)local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                              m_internal + 8))();
        HVar9.m_internal =
             (deUint64)
             (buffer->allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      }
    }
  }
  pDVar5 = local_a8;
  VVar8 = (*local_a8->_vptr_DeviceInterface[0xc])
                    (local_a8,device,
                     (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                     m_internal,(((Allocation *)HVar9.m_internal)->m_memory).m_internal,
                     ((Allocation *)HVar9.m_internal)->m_offset);
  ::vk::checkResult(VVar8,
                    "vkd.bindBufferMemory(device, *buffer.buffer, buffer.allocation->getMemory(), buffer.allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                    ,0xb1);
  if (bufferParameters->memory != (void *)0x0) {
    local_98._0_8_ = 0xcdcdcdcd00000006;
    local_98._8_8_ = 0;
    pAVar3 = (buffer->allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    local_98._16_8_ = (pAVar3->m_memory).m_internal;
    pVStack_80 = (VkAllocationCallbacks *)pAVar3->m_offset;
    local_78 = bufferParameters->size;
    memcpy(pAVar3->m_hostPtr,bufferParameters->memory,local_78);
    VVar8 = (*pDVar5->_vptr_DeviceInterface[9])(pDVar5,device,1,local_98);
    ::vk::checkResult(VVar8,"vkd.flushMappedMemoryRanges(device, 1, &range)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                      ,0xc3);
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         0xcdcdcdcd0000002e;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)CONCAT44(bufferParameters->inputBarrierFlags,0x4000);
    __position._M_current =
         (buffer->memoryBarrier).
         super__Vector_base<vk::VkMemoryBarrier,_std::allocator<vk::VkMemoryBarrier>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (buffer->memoryBarrier).
        super__Vector_base<vk::VkMemoryBarrier,_std::allocator<vk::VkMemoryBarrier>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkMemoryBarrier,std::allocator<vk::VkMemoryBarrier>>::
      _M_realloc_insert<vk::VkMemoryBarrier_const&>
                ((vector<vk::VkMemoryBarrier,std::allocator<vk::VkMemoryBarrier>> *)
                 &buffer->memoryBarrier,__position,(VkMemoryBarrier *)&local_c8);
    }
    else {
      *(VkDevice *)&(__position._M_current)->srcAccessMask =
           local_c8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      *(undefined8 *)__position._M_current = 0xcdcdcdcd0000002e;
      (__position._M_current)->pNext = (void *)0x0;
      ppVVar2 = &(buffer->memoryBarrier).
                 super__Vector_base<vk::VkMemoryBarrier,_std::allocator<vk::VkMemoryBarrier>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppVVar2 = *ppVVar2 + 1;
    }
  }
  return;
}

Assistant:

void createVulkanBuffer (const DeviceInterface& vkd, VkDevice device, Allocator& allocator, const BufferParameters& bufferParameters, Buffer& buffer, MemoryRequirement visibility)
{
	VkBufferCreateInfo	bufferCreateParams;

	deMemset(&bufferCreateParams, 0xcd, sizeof(bufferCreateParams));
	bufferCreateParams.sType					= VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
	bufferCreateParams.pNext					= DE_NULL;
	bufferCreateParams.flags					= 0;
	bufferCreateParams.size						= bufferParameters.size;
	bufferCreateParams.usage					= bufferParameters.usage;
	bufferCreateParams.sharingMode				= bufferParameters.sharingMode;
	bufferCreateParams.queueFamilyIndexCount	= bufferParameters.queueFamilyCount;
	bufferCreateParams.pQueueFamilyIndices		= bufferParameters.queueFamilyIndex;

	buffer.buffer		= createBuffer(vkd, device, &bufferCreateParams);
	buffer.allocation	= allocator.allocate(getBufferMemoryRequirements(vkd, device, *buffer.buffer), visibility);

	VK_CHECK(vkd.bindBufferMemory(device, *buffer.buffer, buffer.allocation->getMemory(), buffer.allocation->getOffset()));

	// If caller provides a host memory buffer for the allocation, then go
	// ahead and copy the provided data into the allocation and update the
	// barrier list with the associated access
	if (bufferParameters.memory != DE_NULL)
	{
		VkMemoryBarrier				barrier;
		VkMappedMemoryRange			range;

		deMemset(&range, 0xcd, sizeof(range));
		range.sType		= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
		range.pNext		= DE_NULL;
		range.memory	= buffer.allocation->getMemory();
		range.offset	= buffer.allocation->getOffset();
		range.size		= bufferParameters.size;

		deMemcpy(buffer.allocation->getHostPtr(), bufferParameters.memory, (size_t)bufferParameters.size);
		VK_CHECK(vkd.flushMappedMemoryRanges(device, 1, &range));

		deMemset(&barrier, 0xcd, sizeof(barrier));
		barrier.sType			= VK_STRUCTURE_TYPE_MEMORY_BARRIER;
		barrier.pNext			= DE_NULL;
		barrier.srcAccessMask	= VK_ACCESS_HOST_WRITE_BIT;
		barrier.dstAccessMask	= bufferParameters.inputBarrierFlags;

		buffer.memoryBarrier.push_back(barrier);
	}
}